

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<kj::Array<unsigned_char>_> __thiscall
kj::AsyncInputStream::readAllBytes(AsyncInputStream *this,uint64_t limit)

{
  PromiseNode **this_00;
  AllReader *limit_00;
  PromiseNode *extraout_RDX;
  Promise<kj::Array<unsigned_char>_> PVar1;
  undefined1 local_40 [8];
  Promise<kj::Array<unsigned_char>_> promise;
  Own<kj::(anonymous_namespace)::AllReader> reader;
  uint64_t limit_local;
  AsyncInputStream *this_local;
  
  this_00 = &promise.super_PromiseBase.node.ptr;
  heap<kj::(anonymous_namespace)::AllReader,kj::AsyncInputStream&>
            ((kj *)this_00,(AsyncInputStream *)limit);
  limit_00 = Own<kj::(anonymous_namespace)::AllReader>::operator->
                       ((Own<kj::(anonymous_namespace)::AllReader> *)this_00);
  anon_unknown_77::AllReader::readAllBytes((AllReader *)local_40,(uint64_t)limit_00);
  mv<kj::Own<kj::(anonymous_namespace)::AllReader>>
            ((Own<kj::(anonymous_namespace)::AllReader> *)&promise.super_PromiseBase.node.ptr);
  Promise<kj::Array<unsigned_char>>::attach<kj::Own<kj::(anonymous_namespace)::AllReader>>
            ((Promise<kj::Array<unsigned_char>> *)this,
             (Own<kj::(anonymous_namespace)::AllReader> *)local_40);
  Promise<kj::Array<unsigned_char>_>::~Promise((Promise<kj::Array<unsigned_char>_> *)local_40);
  Own<kj::(anonymous_namespace)::AllReader>::~Own
            ((Own<kj::(anonymous_namespace)::AllReader> *)&promise.super_PromiseBase.node.ptr);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::Array<unsigned_char>_>)PVar1.super_PromiseBase.node;
}

Assistant:

Promise<Array<byte>> AsyncInputStream::readAllBytes(uint64_t limit) {
  auto reader = kj::heap<AllReader>(*this);
  auto promise = reader->readAllBytes(limit);
  return promise.attach(kj::mv(reader));
}